

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

int __thiscall Gudhi::ripser::Union_find<int>::link(Union_find<int> *this,char *__from,char *__to)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  uint *puVar5;
  vertex_t y_local;
  vertex_t x_local;
  Union_find<int> *this_local;
  
  uVar2 = find(this,(vertex_t)__from);
  uVar3 = find(this,(vertex_t)__to);
  puVar5 = (uint *)(ulong)uVar2;
  if (uVar2 != uVar3) {
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->rank,(long)(int)uVar2);
    bVar1 = *pbVar4;
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->rank,(long)(int)uVar3);
    if (*pbVar4 < bVar1) {
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->parent,(long)(int)uVar3);
      *puVar5 = uVar2;
    }
    else {
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->parent,(long)(int)uVar2);
      *puVar5 = uVar3;
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->rank,(long)(int)uVar2);
      bVar1 = *pbVar4;
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->rank,(long)(int)uVar3);
      puVar5 = (uint *)(ulong)(uint)bVar1;
      if ((uint)bVar1 == (uint)*pbVar4) {
        puVar5 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   (&this->rank,(long)(int)uVar3);
        *(char *)puVar5 = (char)*puVar5 + '\x01';
      }
    }
  }
  return (int)puVar5;
}

Assistant:

void link(vertex_t x, vertex_t y) {
      // this line is redundant, the caller already does it
      if ((x = find(x)) == (y = find(y))) return;
      if (rank[x] > rank[y])
        parent[y] = x;
      else {
        parent[x] = y;
        if (rank[x] == rank[y]) ++rank[y];
      }
    }